

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::PlatformIs32Bit(cmMakefile *this)

{
  int iVar1;
  char *pcVar2;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"CMAKE_INTERNAL_PLATFORM_ABI",&local_31);
  pcVar2 = GetDefinition(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if ((pcVar2 == (char *)0x0) || (iVar1 = strcmp(pcVar2,"ELF X32"), iVar1 != 0)) {
    std::__cxx11::string::string((string *)&local_30,"CMAKE_SIZEOF_VOID_P",&local_31);
    pcVar2 = GetDefinition(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    if (pcVar2 != (char *)0x0) {
      iVar1 = atoi(pcVar2);
      return iVar1 == 4;
    }
  }
  return false;
}

Assistant:

bool cmMakefile::PlatformIs32Bit() const
{
  if (const char* plat_abi =
        this->GetDefinition("CMAKE_INTERNAL_PLATFORM_ABI")) {
    if (strcmp(plat_abi, "ELF X32") == 0) {
      return false;
    }
  }
  if (const char* sizeof_dptr = this->GetDefinition("CMAKE_SIZEOF_VOID_P")) {
    return atoi(sizeof_dptr) == 4;
  }
  return false;
}